

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O0

parse_status_t match_char(scanner_t *scanner,char c,int case_sensitive)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  char scan_char;
  int case_sensitive_local;
  char c_local;
  scanner_t *scanner_local;
  
  if (scanner->cursor < scanner->msg->length) {
    pcVar2 = scanner->msg->buf;
    sVar3 = scanner->cursor;
    scanner->cursor = sVar3 + 1;
    cVar1 = pcVar2[sVar3];
    if (case_sensitive == 0) {
      iVar4 = tolower((int)c);
      iVar5 = tolower((int)cVar1);
      scanner_local._4_4_ = PARSE_NO_MATCH;
      if (iVar4 == iVar5) {
        scanner_local._4_4_ = PARSE_OK;
      }
    }
    else {
      scanner_local._4_4_ = PARSE_NO_MATCH;
      if (c == cVar1) {
        scanner_local._4_4_ = PARSE_OK;
      }
    }
  }
  else {
    scanner_local._4_4_ = PARSE_INCOMPLETE;
  }
  return scanner_local._4_4_;
}

Assistant:

static UPNP_INLINE parse_status_t match_char(
	scanner_t *scanner, char c, int case_sensitive)
{
	char scan_char;

	if (scanner->cursor >= scanner->msg->length) {
		return PARSE_INCOMPLETE;
	}
	/* read next char from scanner */
	scan_char = scanner->msg->buf[scanner->cursor++];

	if (case_sensitive) {
		return c == scan_char ? PARSE_OK : PARSE_NO_MATCH;
	} else {
		return tolower(c) == tolower(scan_char) ? PARSE_OK
							: PARSE_NO_MATCH;
	}
}